

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O2

MPP_RET __thiscall MppDevServer::detach(MppDevServer *this,MppDevMppService *ctx)

{
  undefined8 *p;
  long lVar1;
  long *plVar2;
  MppMutexCond *this_00;
  int iVar3;
  MPP_RET MVar4;
  MppDevBatServ *pMVar5;
  AutoMutex auto_lock;
  
  if (this->mInited == 0) {
    _mpp_log_l(2,"mpp_server","mpp server failed for %s\n",(char *)0x0,this->mServerError);
    MVar4 = MPP_NOK;
  }
  else {
    pMVar5 = bat_server_get(this,ctx->client_type);
    p = (undefined8 *)ctx->serv_ctx;
    if (pMVar5 == (MppDevBatServ *)0x0) {
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server","detach",0x35a
                );
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012026b;
    }
    auto_lock.mLock = pMVar5->lock;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    if (ctx->serv_ctx != (void *)0x0) {
      iVar3 = ctx->client;
      ctx->server = iVar3;
      ctx->serv_ctx = (void *)0x0;
      ctx->batch_io = 0;
      if (p == (undefined8 *)0x0) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session","detach",
                   0x365);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012026b;
        iVar3 = ctx->client;
      }
      if (*(int *)(p + 9) != iVar3) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "session->client == ctx->client","detach",0x366);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012026b;
      }
      if (*(int *)((long)p + 0x4c) != *(int *)(p + 10)) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "session->task_wait == session->task_done","detach",0x367);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012026b;
      }
      if ((undefined8 *)p[3] != p + 3) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "list_empty(&session->list_wait)","detach",0x368);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0012026b:
          abort();
        }
      }
      lVar1 = p[1];
      plVar2 = (long *)p[2];
      *(long **)(lVar1 + 8) = plVar2;
      *plVar2 = lVar1;
      p[1] = p + 1;
      p[2] = p + 1;
      this_00 = (MppMutexCond *)*p;
      if (this_00 != (MppMutexCond *)0x0) {
        MppMutexCond::~MppMutexCond(this_00);
        operator_delete(this_00,0x58);
        *p = 0;
      }
      mpp_mem_pool_put_f("detach",this->mSessionPool,p);
      pMVar5->batch_max_count = pMVar5->batch_max_count + 1;
      pMVar5->session_count = pMVar5->session_count + 1;
    }
    Mutex::Autolock::~Autolock(&auto_lock);
    MVar4 = MPP_OK;
  }
  return MVar4;
}

Assistant:

MPP_RET MppDevServer::detach(MppDevMppService *ctx)
{
    if (!mInited) {
        mpp_err("mpp server failed for %s\n", mServerError);
        return MPP_NOK;
    }

    MppClientType client_type = (MppClientType)ctx->client_type;

    MppDevBatServ *server = bat_server_get(client_type);
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;

    mpp_assert(server);

    AutoMutex auto_lock(server->lock);
    if (NULL == ctx->serv_ctx)
        return MPP_OK;

    ctx->server = ctx->client;
    ctx->serv_ctx = NULL;
    ctx->batch_io = 0;

    mpp_assert(server);
    mpp_assert(session);
    mpp_assert(session->client == ctx->client);
    mpp_assert(session->task_wait == session->task_done);
    mpp_assert(list_empty(&session->list_wait));

    list_del_init(&session->list_server);

    if (session->cond) {
        delete session->cond;
        session->cond = NULL;
    }

    mpp_mem_pool_put(mSessionPool, session);
    server->batch_max_count++;
    server->session_count++;

    return MPP_OK;
}